

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O0

void __thiscall Encode::calcProbabilities(Encode *this)

{
  bool bVar1;
  iterator iVar2;
  iterator __last;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> __result;
  difference_type dVar3;
  size_type sVar4;
  vector<char,_std::allocator<char>_> *this_00;
  double dVar5;
  undefined1 auVar6 [16];
  double local_a8;
  char *local_a0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_98;
  int local_8c;
  reference pcStack_88;
  int countElements;
  char *i;
  iterator __end1;
  iterator __begin1;
  vector<char,_std::allocator<char>_> *__range1;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> tmp;
  Encode *this_local;
  
  this_00 = &this->m_data;
  iVar2 = std::vector<char,_std::allocator<char>_>::begin(this_00);
  tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
       std::vector<char,_std::allocator<char>_>::end(this_00);
  std::sort<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)iVar2._M_current,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_38);
  iVar2 = std::vector<char,_std::allocator<char>_>::begin(this_00);
  __last = std::vector<char,_std::allocator<char>_>::end(this_00);
  __result = std::back_inserter<std::vector<char,std::allocator<char>>>
                       ((vector<char,_std::allocator<char>_> *)local_38);
  std::
  unique_copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)iVar2._M_current,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)__last._M_current
             ,__result);
  __end1 = std::vector<char,_std::allocator<char>_>::begin
                     ((vector<char,_std::allocator<char>_> *)local_38);
  i = (char *)std::vector<char,_std::allocator<char>_>::end
                        ((vector<char,_std::allocator<char>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                *)&i);
    if (!bVar1) break;
    pcStack_88 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&__end1);
    local_98._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&this->m_data);
    local_a0 = (char *)std::vector<char,_std::allocator<char>_>::end(&this->m_data);
    dVar3 = std::
            count<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char>
                      (local_98,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                 )local_a0,pcStack_88);
    local_8c = (int)dVar3;
    dVar5 = (double)local_8c;
    sVar4 = std::vector<char,_std::allocator<char>_>::size(&this->m_data);
    auVar6._8_4_ = (int)(sVar4 >> 0x20);
    auVar6._0_8_ = sVar4;
    auVar6._12_4_ = 0x45300000;
    local_a8 = dVar5 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
    std::vector<double,_std::allocator<double>_>::push_back(&this->m_probabilities,&local_a8);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&__end1);
  }
  std::vector<char,_std::allocator<char>_>::operator=
            (&this->m_data,(vector<char,_std::allocator<char>_> *)local_38);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_38)
  ;
  return;
}

Assistant:

void calcProbabilities() {
        sort(m_data.begin(), m_data.end());
        vector<char> tmp;
        unique_copy(m_data.begin(), m_data.end(), back_inserter(tmp));
        for (auto &i : tmp) {
            int countElements = count(m_data.begin(), m_data.end(), i);
            m_probabilities.push_back((double) countElements / m_data.size());
        }
        m_data = tmp;
    }